

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_NumExtensionsWithRepeatedFields_Test::
TestBody(ExtensionSetTest_NumExtensionsWithRepeatedFields_Test *this)

{
  int iVar1;
  char *pcVar2;
  string_view name;
  Metadata MVar3;
  ExtensionSet set;
  FieldDescriptor *desc;
  TestAllExtensions msg;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  AssertHelper local_70;
  internal local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  ExtensionSet local_58;
  FieldDescriptor *local_40;
  TestAllExtensions local_38;
  
  proto2_unittest::TestAllExtensions::TestAllExtensions(&local_38,(Arena *)0x0);
  local_58.arena_ = (Arena *)0x0;
  local_58.flat_capacity_ = 0;
  local_58.flat_size_ = 0;
  local_58.map_.flat = (KeyValue *)0x0;
  MVar3 = proto2_unittest::TestAllExtensions::GetMetadata
                    ((TestAllExtensions *)proto2_unittest::_TestAllExtensions_default_instance_);
  name._M_str = "repeated_int32_extension";
  name._M_len = 0x18;
  local_40 = FileDescriptor::FindExtensionByName((MVar3.descriptor)->file_,name);
  local_78._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<google::protobuf::FieldDescriptor_const*,decltype(nullptr)>
            (local_68,"desc","nullptr",&local_40,&local_78._M_head_impl);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar2 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x598,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
  }
  else {
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
    ExtensionSet::MutableRawRepeatedField(&local_58,local_40->number_,'\x05',false,local_40);
    iVar1 = ExtensionSet::NumExtensions(&local_58);
    local_78._M_head_impl._0_4_ = iVar1;
    local_70.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              (local_68,"set.NumExtensions()","1",(int *)&local_78,(int *)&local_70);
    if (local_68[0] != (internal)0x0) goto LAB_006ad4c8;
    testing::Message::Message((Message *)&local_78);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar2 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x59b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  if (local_78._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_78._M_head_impl + 8))();
  }
LAB_006ad4c8:
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  ExtensionSet::~ExtensionSet(&local_58);
  proto2_unittest::TestAllExtensions::~TestAllExtensions(&local_38);
  return;
}

Assistant:

TEST(ExtensionSetTest, NumExtensionsWithRepeatedFields) {
  unittest::TestAllExtensions msg;
  ExtensionSet set;
  const auto* desc =
      unittest::TestAllExtensions::descriptor()->file()->FindExtensionByName(
          "repeated_int32_extension");
  ASSERT_NE(desc, nullptr);
  set.MutableRawRepeatedField(desc->number(), WireFormatLite::TYPE_INT32, false,
                              desc);
  EXPECT_EQ(set.NumExtensions(), 1);
}